

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

void __thiscall
dynet::LookupNode::backward_dev_impl<dynet::Device_CPU>
          (LookupNode *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  ostream *this_00;
  runtime_error *this_01;
  uint in_R9D;
  ostringstream oss;
  string local_1d8 [48];
  ostringstream local_1a8 [380];
  uint local_2c;
  
  local_2c = in_R9D;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  this_00 = std::operator<<((ostream *)local_1a8,"called backward() on arity 0 node: i = ");
  std::ostream::operator<<(this_00,local_2c);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_01,local_1d8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LookupNode::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  DYNET_RUNTIME_ERR("called backward() on arity 0 node: i = " << i);
}